

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O2

IJKLBounds *
getIJKLBounds(IJKLBounds *__return_storage_ptr__,DataFieldInfo *info,Bounds *iBounds,Bounds *jBounds
             ,Bounds *kBounds,Bounds *lBounds)

{
  int iVar1;
  int iVar2;
  
  iVar1 = info->iSize_;
  iVar2 = iBounds->lower;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  __return_storage_ptr__->iLower = iVar2;
  iVar1 = iVar1 + -1;
  if (iBounds->upper < iVar1) {
    iVar1 = iBounds->upper;
  }
  __return_storage_ptr__->iUpper = iVar1;
  iVar1 = info->jSize_;
  iVar2 = jBounds->lower;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  __return_storage_ptr__->jLower = iVar2;
  iVar1 = iVar1 + -1;
  if (jBounds->upper < iVar1) {
    iVar1 = jBounds->upper;
  }
  __return_storage_ptr__->jUpper = iVar1;
  iVar1 = info->kSize_;
  iVar2 = kBounds->lower;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  __return_storage_ptr__->kLower = iVar2;
  iVar1 = iVar1 + -1;
  if (kBounds->upper < iVar1) {
    iVar1 = kBounds->upper;
  }
  __return_storage_ptr__->kUpper = iVar1;
  iVar1 = info->lSize_;
  iVar2 = 0;
  if (0 < lBounds->lower) {
    iVar2 = lBounds->lower;
  }
  __return_storage_ptr__->lLower = iVar2;
  iVar1 = iVar1 + -1;
  if (lBounds->upper < iVar1) {
    iVar1 = lBounds->upper;
  }
  __return_storage_ptr__->lUpper = iVar1;
  return __return_storage_ptr__;
}

Assistant:

IJKLBounds getIJKLBounds(const ser::DataFieldInfo& info,
                         const Bounds& iBounds, const Bounds& jBounds,
                         const Bounds& kBounds, const Bounds& lBounds)
{
	IJKLBounds bounds;
	int iSize = info.iSize();
	bounds.iLower = std::max(0, iBounds.lower);
	bounds.iUpper = std::min(iSize - 1, iBounds.upper);
	int jSize = info.jSize();
	bounds.jLower = std::max(0, jBounds.lower);
	bounds.jUpper = std::min(jSize - 1, jBounds.upper);
	int kSize = info.kSize();
	bounds.kLower = std::max(0, kBounds.lower);
	bounds.kUpper = std::min(kSize - 1, kBounds.upper);
	int lSize = info.lSize();
	bounds.lLower = std::max(0, lBounds.lower);
	bounds.lUpper = std::min(lSize - 1, lBounds.upper);
	return bounds;
}